

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.h
# Opt level: O1

void __thiscall
lambda::Parse_ast::Lambda::Lambda(Lambda *this,string *parameter,Parse_ast *expression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  *this_00;
  
  paVar1 = &(this->parameter_).field_2;
  (this->parameter_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (parameter->_M_dataplus)._M_p;
  paVar2 = &parameter->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&parameter->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->parameter_).field_2 + 8) = uVar4;
  }
  else {
    (this->parameter_)._M_dataplus._M_p = pcVar3;
    (this->parameter_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->parameter_)._M_string_length = parameter->_M_string_length;
  (parameter->_M_dataplus)._M_p = (pointer)paVar2;
  parameter->_M_string_length = 0;
  (parameter->field_2)._M_local_buf[0] = '\0';
  this_00 = (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
             *)operator_new(0x30);
  std::__detail::__variant::
  _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::_Move_ctor_base(this_00,(_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                             *)expression);
  (this->expression_)._M_t.
  super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
  super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
  super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl = (Parse_ast *)this_00;
  return;
}

Assistant:

explicit Lambda(std::string parameter, Parse_ast expression)
        : parameter_(std::move(parameter)),
          expression_(std::make_unique<Parse_ast>(std::move(expression))) {}